

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O2

void kv_ins_var(btree_kv_ops *kv_ops)

{
  int iVar1;
  bnode *__ptr;
  char *__format;
  uint64_t v_out;
  uint64_t value;
  char local_48 [16];
  char local_38 [8];
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  value = 10;
  __ptr = dummy_node('\b','\b',1);
  builtin_strncpy(local_38,"key",4);
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  (*kv_ops->ins_kv)(__ptr,0,local_38,&value);
  (*kv_ops->get_kv)(__ptr,0,local_48,&v_out);
  iVar1 = strcmp(local_48,local_38);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x167);
    kv_ins_var(btree_kv_ops*)::__test_pass = '\x01';
    iVar1 = strcmp(local_48,local_38);
    if (iVar1 != 0) {
      __assert_fail("!(strcmp(k_out, key))",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x167,"void kv_ins_var(btree_kv_ops *)");
    }
  }
  if (v_out != value) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x168);
    kv_ins_var(btree_kv_ops*)::__test_pass = '\x01';
    if (v_out != value) {
      __assert_fail("v_out == value",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x168,"void kv_ins_var(btree_kv_ops *)");
    }
  }
  free(__ptr);
  memleak_end();
  __format = "%s PASSED\n";
  if (kv_ins_var(btree_kv_ops*)::__test_pass != '\0') {
    __format = "%s FAILED\n";
  }
  fprintf(_stderr,__format,"kv_ins_var");
  return;
}

Assistant:

void kv_ins_var(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    uint8_t ksize, vsize;
    idx_t idx;
    uint64_t value = 10;
    uint64_t v_out;

    ksize = 8;
    vsize = sizeof(value);
    node = dummy_node(ksize, vsize, 1);

    char *key = alca(char, ksize);
    char *k_out = alca(char, ksize);
    memset(key, 0x0, ksize);
    strcpy(key, "key");

    // insert key into to empty node
    idx = 0;
    kv_ops->ins_kv(node, idx, key, (void *)&value);

    // get and verify
    kv_ops->get_kv(node, idx, k_out, (void *)&v_out);
    TEST_CHK(!(strcmp(k_out, key)));
    TEST_CHK(v_out == value);

    free(node);
    memleak_end();
    TEST_RESULT("kv_ins_var");
}